

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::scan
               (Recurser *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  SIMDExtract *pSVar2;
  ArrayInit *pAVar3;
  SIMDLoad *pSVar4;
  GlobalSet *pGVar5;
  AtomicCmpxchg *pAVar6;
  Return *pRVar7;
  MemoryCopy *pMVar8;
  AtomicWait *pAVar9;
  TupleMake *pTVar10;
  Load *pLVar11;
  CallRef *pCVar12;
  Call *pCVar13;
  StructNew *pSVar14;
  ArrayNew *pAVar15;
  ArrayNewFixed *pAVar16;
  Expression **ppEVar17;
  Break *pBVar18;
  Switch *pSVar19;
  CallIndirect *pCVar20;
  Try *pTVar21;
  Store *pSVar22;
  Throw *pTVar23;
  MemoryGrow *pMVar24;
  Name *currp_00;
  ulong uVar25;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitBlock,currp
              );
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar25 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case IfId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitIf,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::maybePushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pMVar8->size);
    goto LAB_0082595e;
  case LoopId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitLoop,currp)
    ;
    pGVar5 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_008254d6;
  case BreakId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitBreak,currp
              );
    pBVar18 = Expression::cast<wasm::Break>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::maybePushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pBVar18->condition);
    ppEVar17 = &pBVar18->value;
    goto LAB_008254ac;
  case SwitchId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSwitch,
               currp);
    pSVar19 = Expression::cast<wasm::Switch>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pSVar19->condition);
    ppEVar17 = &pSVar19->value;
    goto LAB_008254ac;
  case CallId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitCall,currp)
    ;
    pCVar13 = Expression::cast<wasm::Call>(this);
    uVar25 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case CallIndirectId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitCallIndirect,currp);
    pCVar20 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pCVar20->target);
    uVar25 = (ulong)(uint)(pCVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar20->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case LocalGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitLocalGet,
               currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitLocalSet,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_008257f2;
  case GlobalGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitGlobalGet,
               currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitGlobalSet,
               currp);
    pGVar5 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_008254d6;
  case LoadId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitLoad,currp)
    ;
    pLVar11 = Expression::cast<wasm::Load>(this);
    ppEVar17 = &pLVar11->ptr;
    goto LAB_008259ec;
  case StoreId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStore,currp
              );
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_008257b9;
  case ConstId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitConst,currp
              );
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitUnary,currp
              );
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_008257f2;
  case BinaryId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitBinary,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_008259c6;
  case SelectId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSelect,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00825536;
  case DropId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitDrop,currp)
    ;
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::Drop>(this);
    break;
  case ReturnId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitReturn,
               currp);
    pRVar7 = Expression::cast<wasm::Return>(this);
    ppEVar17 = &pRVar7->value;
    goto LAB_008254ac;
  case MemorySizeId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemoryGrow,
               currp);
    pMVar24 = Expression::cast<wasm::MemoryGrow>(this);
    break;
  case NopId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitUnreachable
               ,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitAtomicRMW,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00825870;
  case AtomicCmpxchgId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitAtomicCmpxchg,currp);
    pAVar6 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00825853;
  case AtomicWaitId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitAtomicWait,
               currp);
    pAVar9 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_008251f3;
  case AtomicNotifyId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitAtomicNotify,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_008259c6;
  case AtomicFenceId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitAtomicFence
               ,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDExtract
               ,currp);
    pSVar2 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_008257f2;
  case SIMDReplaceId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDReplace
               ,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    currp_00 = (Name *)&pAVar9->timeout;
    goto LAB_008259d4;
  case SIMDShuffleId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDShuffle
               ,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_0082595e;
  case SIMDTernaryId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDTernary
               ,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_008251f3;
  case SIMDShiftId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDShift,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_008259c6;
  case SIMDLoadId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDLoad,
               currp);
    pSVar4 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_0082568e;
  case SIMDLoadStoreLaneId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_008257b9:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pSVar22->value);
    ppEVar17 = &pSVar22->ptr;
    goto LAB_008259ec;
  case MemoryInitId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemoryInit,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
LAB_00825853:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pAVar6->replacement);
    goto LAB_00825870;
  case DataDropId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitDataDrop,
               currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemoryCopy,
               currp);
    pMVar8 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00825536;
  case MemoryFillId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemoryFill,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00825536;
  case PopId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefNull,
               currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefIsNull,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefIsNull>(this);
    break;
  case RefFuncId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefFunc,
               currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefEq,currp
              );
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_0082595e;
  case TableGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTableGet,
               currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_008254d6:
    ppEVar17 = &pGVar5->value;
    goto LAB_008259ec;
  case TableSetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTableSet,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00825870;
  case TableSizeId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTableSize,
               currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTableGrow,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
LAB_00825870:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pAVar6->expected);
    ppEVar17 = &pAVar6->ptr;
    goto LAB_008259ec;
  case TryId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTry,currp);
    pTVar21 = Expression::cast<wasm::Try>(this);
    uVar25 = (ulong)(uint)(pTVar21->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar21->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    ppEVar17 = &pTVar21->body;
    goto LAB_008259ec;
  case ThrowId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitThrow,currp
              );
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar25 = (ulong)(uint)(pTVar23->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar23->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case RethrowId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRethrow,
               currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case TupleMakeId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTupleMake,
               currp);
    pTVar10 = Expression::cast<wasm::TupleMake>(this);
    uVar25 = (ulong)(uint)(pTVar10->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar10->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case TupleExtractId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitTupleExtract,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::TupleExtract>(this);
    break;
  case I31NewId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitI31New,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31New>(this);
    break;
  case I31GetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitI31Get,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31Get>(this);
    break;
  case CallRefId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitCallRef,
               currp);
    pCVar12 = Expression::cast<wasm::CallRef>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pCVar12->target);
    uVar25 = (ulong)(uint)(pCVar12->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar12->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case RefTestId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefTest,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefTest>(this);
    break;
  case RefCastId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefCast,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefCast>(this);
    break;
  case BrOnId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitBrOn,currp)
    ;
    pSVar4 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_0082568e:
    ppEVar17 = &pSVar4->ptr;
    goto LAB_008259ec;
  case StructNewId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStructNew,
               currp);
    pSVar14 = Expression::cast<wasm::StructNew>(this);
    uVar25 = (ulong)(uint)(pSVar14->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar14->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case StructGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStructGet,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_008257f2;
  case StructSetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStructSet,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_008259c6;
  case ArrayNewId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayNew,
               currp);
    pAVar15 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pAVar15->size);
    ppEVar17 = &pAVar15->init;
LAB_008254ac:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::maybePushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               ppEVar17);
    return;
  case ArrayNewSegId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayNewSeg
               ,currp);
    pAVar3 = (ArrayInit *)Expression::cast<wasm::ArrayNewSeg>(this);
    goto LAB_0082537b;
  case ArrayNewFixedId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitArrayNewFixed,currp);
    pAVar16 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar25 = (ulong)(uint)(pAVar16->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar16->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case ArrayGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayGet,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_0082595e;
  case ArraySetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArraySet,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00825536;
  case ArrayLenId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayLen,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::ArrayLen>(this);
    break;
  case ArrayCopyId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayCopy,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&(pMVar8->destMemory).super_IString.str._M_str);
    goto LAB_008251ac;
  case ArrayFillId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayFill,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_008251ac:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pMVar8->destMemory);
    goto LAB_00825536;
  case ArrayInitId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayInit,
               currp);
    pAVar3 = Expression::cast<wasm::ArrayInit>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pAVar3->size);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pAVar3->offset);
LAB_0082537b:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pAVar3->index);
    ppEVar17 = &pAVar3->ref;
    goto LAB_008259ec;
  case RefAsId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefAs,currp
              );
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_008257f2;
  case StringNewId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStringNew,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::maybePushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pAVar9->expectedType);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::maybePushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pAVar9->timeout);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::maybePushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pAVar9->expected);
    goto LAB_008259df;
  case StringConstId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStringConst
               ,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringMeasure,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
    goto LAB_008257f2;
  case StringEncodeId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringEncode,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::maybePushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pAVar9->timeout);
    goto LAB_00825636;
  case StringConcatId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringConcat,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_0082595e;
  case StringEqId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStringEq,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
    goto LAB_008259c6;
  case StringAsId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStringAs,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringAs>(this);
LAB_008257f2:
    ppEVar17 = &pSVar2->vec;
    goto LAB_008259ec;
  case StringWTF8AdvanceId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringWTF8Advance,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF8Advance>(this);
LAB_00825536:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pMVar8->size);
    goto LAB_0082595e;
  case StringWTF16GetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringWTF16Get,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_0082595e;
  case StringIterNextId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringIterNext,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::StringIterNext>(this);
    break;
  case StringIterMoveId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringIterMove,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringIterMove>(this);
LAB_008259c6:
    currp_00 = (Name *)&pAVar9->expected;
LAB_008259d4:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)currp_00);
LAB_008259df:
    ppEVar17 = &pAVar9->ptr;
    goto LAB_008259ec;
  case StringSliceWTFId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringSliceWTF,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_008251f3:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pAVar9->timeout);
LAB_00825636:
    currp_00 = (Name *)&pAVar9->expected;
    goto LAB_008259d4;
  case StringSliceIterId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringSliceIter,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringSliceIter>(this);
LAB_0082595e:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               &pMVar8->source);
    ppEVar17 = &pMVar8->dest;
    goto LAB_008259ec;
  default:
    return;
  }
  ppEVar17 = &pMVar24->delta;
LAB_008259ec:
  Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
            ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,ppEVar17
            );
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }